

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

void test_ecdsa_sign(void)

{
  do_test_ecdsa_sign(0x19f,secp256r1_signature_schemes);
  do_test_ecdsa_sign(0x2cb,secp384r1_signature_schemes);
  do_test_ecdsa_sign(0x2cc,secp521r1_signature_schemes);
  return;
}

Assistant:

static void test_ecdsa_sign(void)
{
    do_test_ecdsa_sign(NID_X9_62_prime256v1, secp256r1_signature_schemes);
#if PTLS_OPENSSL_HAVE_SECP384R1
    do_test_ecdsa_sign(NID_secp384r1, secp384r1_signature_schemes);
#endif
#if PTLS_OPENSSL_HAVE_SECP521R1
    do_test_ecdsa_sign(NID_secp521r1, secp521r1_signature_schemes);
#endif
}